

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu.cpp
# Opt level: O3

ResamplerFunc PrepareResampler(Resampler resampler,ALuint increment,InterpState *state)

{
  uint uVar1;
  ResamplerFunc p_Var2;
  code *pcVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  switch(resampler) {
  case Linear:
    if ((CPUCapFlags & 8U) == 0) {
      if ((CPUCapFlags & 2U) == 0) {
        pcVar3 = Resample_<LerpTag,CTag>;
      }
      else {
        pcVar3 = Resample_<LerpTag,SSE2Tag>;
      }
    }
    else {
      pcVar3 = Resample_<LerpTag,SSE4Tag>;
    }
    break;
  case Cubic:
    pcVar3 = Resample_<CubicTag,CTag>;
    break;
  case FastBSinc12:
  case BSinc12:
    if (increment < 0x1001) {
      fVar5 = 0.0;
      uVar4 = 0xf;
    }
    else {
      fVar6 = (4096.0 / (float)increment - 0.16479042) * 15.0 * 1.1973042;
      fVar5 = 0.0;
      if (0.0 <= fVar6) {
        fVar5 = fVar6;
      }
      uVar4 = (ulong)(uint)(int)fVar5;
      fVar5 = asinf(fVar5 - (float)uVar4);
      fVar5 = cosf(fVar5);
      fVar5 = 1.0 - fVar5;
    }
    (state->bsinc).sf = fVar5;
    uVar1 = bsinc12.m[uVar4];
    (state->bsinc).m = uVar1;
    (state->bsinc).l = (uVar1 >> 1) - 1;
    (state->bsinc).filter =
         (float *)((long)&(anonymous_namespace)::bsinc12_filter +
                  (ulong)bsinc12.filterOffset[uVar4] * 4);
    p_Var2 = (ResamplerFunc)
             (*(code *)(&DAT_00178318 +
                       *(int *)(&DAT_00178318 + (ulong)(resampler - FastBSinc12) * 4)))();
    return p_Var2;
  case FastBSinc24:
  case BSinc24:
    if (increment < 0x1001) {
      fVar5 = 0.0;
      uVar4 = 0xf;
    }
    else {
      fVar6 = (4096.0 / (float)increment - 0.078812815) * 15.0 * 1.0855557;
      fVar5 = 0.0;
      if (0.0 <= fVar6) {
        fVar5 = fVar6;
      }
      uVar4 = (ulong)(uint)(int)fVar5;
      fVar5 = asinf(fVar5 - (float)uVar4);
      fVar5 = cosf(fVar5);
      fVar5 = 1.0 - fVar5;
    }
    (state->bsinc).sf = fVar5;
    uVar1 = bsinc24.m[uVar4];
    (state->bsinc).m = uVar1;
    (state->bsinc).l = (uVar1 >> 1) - 1;
    (state->bsinc).filter =
         (float *)((long)&(anonymous_namespace)::bsinc24_filter +
                  (ulong)bsinc24.filterOffset[uVar4] * 4);
    p_Var2 = (ResamplerFunc)
             (*(code *)(&DAT_00178318 +
                       *(int *)(&DAT_00178318 + (ulong)(resampler - FastBSinc12) * 4)))();
    return p_Var2;
  default:
    pcVar3 = Resample_<PointTag,CTag>;
  }
  return pcVar3;
}

Assistant:

ResamplerFunc PrepareResampler(Resampler resampler, ALuint increment, InterpState *state)
{
    switch(resampler)
    {
    case Resampler::Point:
    case Resampler::Linear:
    case Resampler::Cubic:
        break;
    case Resampler::FastBSinc12:
    case Resampler::BSinc12:
        BsincPrepare(increment, &state->bsinc, &bsinc12);
        break;
    case Resampler::FastBSinc24:
    case Resampler::BSinc24:
        BsincPrepare(increment, &state->bsinc, &bsinc24);
        break;
    }
    return SelectResampler(resampler, increment);
}